

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

sector_t * __thiscall sector_t::GetHeightSec(sector_t *this)

{
  sector_t *psVar1;
  extsector_t *peVar2;
  ulong uVar3;
  bool bVar4;
  
  psVar1 = this->heightsec;
  if ((psVar1 != (sector_t *)0x0) && ((psVar1->MoreFlags & 0x10) == 0)) {
    peVar2 = this->e;
    if (peVar2 == (extsector_t *)0x0) {
      return psVar1;
    }
    uVar3 = (ulong)(peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar3 == 0) {
      return psVar1;
    }
    do {
      bVar4 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar4) {
        return psVar1;
      }
    } while ((~(peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar3]->flags & 9
             ) != 0);
  }
  return (sector_t *)0x0;
}

Assistant:

sector_t *sector_t::GetHeightSec() const 
{
	if (heightsec == NULL)
	{
		return NULL;
	}
	if (heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC)
	{
		return NULL;
	}
	if (e && e->XFloor.ffloors.Size())
	{
		// If any of these fake floors render their planes, ignore heightsec.
		for (unsigned i = e->XFloor.ffloors.Size(); i-- > 0; )
		{
			if ((e->XFloor.ffloors[i]->flags & (FF_EXISTS | FF_RENDERPLANES)) == (FF_EXISTS | FF_RENDERPLANES))
			{
				return NULL;
			}
		}
	}
	return heightsec;
}